

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O3

void __thiscall wasm::I64ToI32Lowering::lowerExtendSInt64(I64ToI32Lowering *this,Unary *curr)

{
  Unary *pUVar1;
  Builder *pBVar2;
  undefined4 uVar3;
  Unary *this_00;
  LocalSet *pLVar4;
  Expression *pEVar5;
  Const *pCVar6;
  Binary *this_01;
  Block *pBVar7;
  TempVar local_a8;
  Block *local_88;
  undefined1 local_80 [8];
  TempVar highBits;
  undefined1 local_58 [8];
  TempVar lowBits;
  
  getTemp((TempVar *)local_80,this,(Type)0x2);
  getTemp((TempVar *)local_58,this,(Type)0x2);
  fetchOutParam(&local_a8,this,curr->value);
  TempVar::~TempVar(&local_a8);
  pUVar1 = (Unary *)curr->value;
  if (curr->op == ExtendS8Int64) {
    this_00 = (Unary *)MixedArena::allocSpace
                                 (&((this->builder)._M_t.
                                    super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                                    .super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl)->
                                   wasm->allocator,0x20,8);
    (this_00->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression._id = UnaryId;
    (this_00->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression.type.id = 0;
    this_00->op = ExtendS8Int32;
    this_00->value = (Expression *)pUVar1;
    Unary::finalize(this_00);
  }
  else {
    this_00 = pUVar1;
    if (curr->op == ExtendS16Int64) {
      this_00 = (Unary *)MixedArena::allocSpace
                                   (&((this->builder)._M_t.
                                      super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                                      .super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl)->
                                     wasm->allocator,0x20,8);
      (this_00->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression._id = UnaryId;
      (this_00->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression.type.id = 0;
      this_00->op = ExtendS16Int32;
      this_00->value = (Expression *)pUVar1;
      Unary::finalize(this_00);
    }
  }
  if ((char)lowBits.pass != '\x01') {
    pLVar4 = Builder::makeLocalSet
                       ((this->builder)._M_t.
                        super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                        .super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl,local_58._0_4_,
                        (Expression *)this_00);
    uVar3 = local_58._0_4_;
    if (((char)highBits.pass != '\x01') &&
       (highBits.ty.id = (uintptr_t)pLVar4, (char)lowBits.pass != '\x01')) {
      pBVar2 = (this->builder)._M_t.
               super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
               super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
      lowBits.ty.id._4_4_ = local_80._0_4_;
      pEVar5 = (Expression *)MixedArena::allocSpace(&pBVar2->wasm->allocator,0x18,8);
      pEVar5->_id = LocalGetId;
      *(undefined4 *)(pEVar5 + 1) = uVar3;
      (pEVar5->type).id = 2;
      pCVar6 = Builder::makeConst<int>
                         ((this->builder)._M_t.
                          super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                          .super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl,0x1f);
      this_01 = (Binary *)MixedArena::allocSpace(&pBVar2->wasm->allocator,0x28,8);
      (this_01->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
      (this_01->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
      this_01->op = ShrSInt32;
      this_01->left = pEVar5;
      this_01->right = (Expression *)pCVar6;
      Binary::finalize(this_01);
      pLVar4 = Builder::makeLocalSet(pBVar2,lowBits.ty.id._4_4_,(Expression *)this_01);
      if ((char)lowBits.pass != '\x01') {
        pBVar2 = (this->builder)._M_t.
                 super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
                 super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
        pEVar5 = (Expression *)MixedArena::allocSpace(&pBVar2->wasm->allocator,0x18,8);
        pEVar5->_id = LocalGetId;
        *(undefined4 *)(pEVar5 + 1) = local_58._0_4_;
        (pEVar5->type).id = 2;
        pBVar7 = Builder::blockify(pBVar2,(Expression *)highBits.ty.id,(Expression *)pLVar4);
        pBVar7 = Builder::blockify(pBVar2,(Expression *)pBVar7,pEVar5);
        local_88 = pBVar7;
        std::
        _Hashtable<wasm::Expression*,std::pair<wasm::Expression*const,wasm::I64ToI32Lowering::TempVar>,std::allocator<std::pair<wasm::Expression*const,wasm::I64ToI32Lowering::TempVar>>,std::__detail::_Select1st,std::equal_to<wasm::Expression*>,std::hash<wasm::Expression*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
        ::_M_emplace<wasm::Expression*&,wasm::I64ToI32Lowering::TempVar>
                  ((_Hashtable<wasm::Expression*,std::pair<wasm::Expression*const,wasm::I64ToI32Lowering::TempVar>,std::allocator<std::pair<wasm::Expression*const,wasm::I64ToI32Lowering::TempVar>>,std::__detail::_Select1st,std::equal_to<wasm::Expression*>,std::hash<wasm::Expression*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                    *)&this->highBitVars,&local_88,local_80);
        Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>::replaceCurrent
                  (&(this->
                    super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
                    ).
                    super_PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                    .
                    super_Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                   ,(Expression *)pBVar7);
        TempVar::~TempVar((TempVar *)local_58);
        TempVar::~TempVar((TempVar *)local_80);
        return;
      }
    }
  }
  __assert_fail("!moved",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/I64ToI32Lowering.cpp"
                ,0x4f,"Index wasm::I64ToI32Lowering::TempVar::operator unsigned int()");
}

Assistant:

void lowerExtendSInt64(Unary* curr) {
    TempVar highBits = getTemp();
    TempVar lowBits = getTemp();

    // free the temp var
    fetchOutParam(curr->value);

    Expression* lowValue = curr->value;
    switch (curr->op) {
      case ExtendS8Int64:
        lowValue = builder->makeUnary(ExtendS8Int32, lowValue);
        break;
      case ExtendS16Int64:
        lowValue = builder->makeUnary(ExtendS16Int32, lowValue);
        break;
      default:
        break;
    }

    LocalSet* setLow = builder->makeLocalSet(lowBits, lowValue);
    LocalSet* setHigh = builder->makeLocalSet(
      highBits,
      builder->makeBinary(ShrSInt32,
                          builder->makeLocalGet(lowBits, Type::i32),
                          builder->makeConst(int32_t(31))));

    Block* result = builder->blockify(
      setLow, setHigh, builder->makeLocalGet(lowBits, Type::i32));

    setOutParam(result, std::move(highBits));
    replaceCurrent(result);
  }